

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O1

Instruction * __thiscall
Hpipe::InstructionGraph::make_boyer_moore_rec
          (InstructionGraph *this,
          Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *front,
          InstructionNextChar *next_char,int orig_front_size)

{
  pointer ppVar1;
  long lVar2;
  pointer pCVar3;
  ulong uVar4;
  InstructionMultiCond *pIVar5;
  Instruction *inst;
  uint uVar6;
  ulong uVar7;
  Cond *c;
  Cond *pCVar8;
  pointer pCVar9;
  __normal_iterator<Hpipe::Cond_*,_std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>_> __i;
  long lVar10;
  pointer ppVar11;
  bool bVar12;
  Vec<Hpipe::Cond> conds;
  Cond t;
  Vec<Hpipe::Cond> old_conds;
  Cond i;
  pointer local_108;
  Vec<Hpipe::Cond> local_f8;
  pointer local_e0;
  Cond local_d8;
  InstructionGraph *local_b8;
  InstructionNextChar *local_b0;
  Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *local_a8;
  Transition local_a0;
  vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> local_78;
  InstructionMultiCond *local_60;
  Cond local_58;
  
  local_108 = (front->
              super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
              ).
              super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_e0 = (front->
             super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
             ).
             super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pIVar5 = (InstructionMultiCond *)local_108->second;
  uVar4 = (long)local_e0 - (long)local_108 >> 5;
  bVar12 = uVar4 < 2;
  if ((!bVar12) && ((InstructionMultiCond *)local_108[1].second == pIVar5)) {
    uVar6 = 2;
    do {
      uVar7 = (ulong)uVar6;
      bVar12 = uVar4 <= uVar7;
      if (uVar4 <= uVar7) break;
      uVar6 = uVar6 + 1;
    } while ((InstructionMultiCond *)local_108[uVar7].second == pIVar5);
  }
  if (!bVar12) {
    local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
    super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
    _M_start = (Cond *)0x0;
    local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
    super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
    _M_finish = (Cond *)0x0;
    local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
    super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_b8 = this;
    local_b0 = next_char;
    local_a8 = front;
    if (local_108 != local_e0) {
      do {
        std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::vector
                  (&local_78,(vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_> *)&local_f8);
        Cond::Cond((Cond *)&local_a0,
                   (local_108->first).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                   super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1);
        pCVar3 = local_78.super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pCVar8 = local_78.super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
            super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
            super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
          super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
               super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        for (; pCVar8 != pCVar3; pCVar8 = pCVar8 + 1) {
          Cond::operator&(&local_58,(Cond *)&local_a0,pCVar8);
          bVar12 = Cond::operator_cast_to_bool(&local_58);
          if (bVar12) {
            std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>::emplace_back<Hpipe::Cond_const&>
                      ((vector<Hpipe::Cond,std::allocator<Hpipe::Cond>> *)&local_f8,&local_58);
          }
          Cond::operator~((Cond *)&local_a0);
          Cond::operator&(&local_58,&local_d8,pCVar8);
          bVar12 = Cond::operator_cast_to_bool(&local_58);
          if (bVar12) {
            std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>::emplace_back<Hpipe::Cond_const&>
                      ((vector<Hpipe::Cond,std::allocator<Hpipe::Cond>> *)&local_f8,&local_58);
          }
          Cond::operator~(pCVar8);
          Cond::operator&=((Cond *)&local_a0,&local_58);
        }
        bVar12 = Cond::operator_cast_to_bool((Cond *)&local_a0);
        if (bVar12) {
          std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>::emplace_back<Hpipe::Cond_const&>
                    ((vector<Hpipe::Cond,std::allocator<Hpipe::Cond>> *)&local_f8,(Cond *)&local_a0)
          ;
        }
        if (local_78.super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
            super__Vector_impl_data._M_start != (Cond *)0x0) {
          operator_delete(local_78.super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_108 = local_108 + 1;
      } while (local_108 != local_e0);
    }
    pCVar9 = local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
             super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar3 = local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
             super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
        super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
        super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar10 = (long)local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                     super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                     super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar4 = lVar10 >> 5;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
                (local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                 super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                 super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar10 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
                  (pCVar3,pCVar9);
      }
      else {
        pCVar8 = pCVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
                  (pCVar3,pCVar8);
        for (; pCVar8 != pCVar9; pCVar8 = pCVar8 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Hpipe::Cond*,std::vector<Hpipe::Cond,std::allocator<Hpipe::Cond>>>,__gnu_cxx::__ops::_Val_comp_iter<Hpipe::InstructionGraph::make_boyer_moore_rec(Hpipe::Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>const&,Hpipe::InstructionNextChar*,int)::__1>>
                    (pCVar8);
        }
      }
    }
    pIVar5 = (InstructionMultiCond *)operator_new(0x198);
    ppVar11 = (local_a8->
              super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
              ).
              super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    InstructionMultiCond::InstructionMultiCond
              (pIVar5,&(local_b0->super_Instruction).cx,&local_f8,
               (int)((ulong)((long)*(pointer *)
                                    ((long)&(ppVar11->first).
                                            super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>
                                    + 8) -
                            *(long *)&(ppVar11->first).
                                      super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>) >> 5)
               - orig_front_size);
    pIVar5 = PtrPool<Hpipe::Instruction,32>::operator<<
                       ((PtrPool<Hpipe::Instruction,32> *)&local_b8->inst_pool,pIVar5);
    pCVar3 = local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
             super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
        super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
        super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_e0 = (pointer)&(pIVar5->super_Instruction).next;
      pCVar9 = local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
               super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = pIVar5;
      do {
        local_58.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_58.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_58.p.super__Base_bitset<4UL>._M_w[2] = 0;
        ppVar1 = (local_a8->
                 super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                 ).
                 super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar11 = (local_a8->
                       super_vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                       ).
                       super__Vector_base<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar1;
            ppVar11 = ppVar11 + 1) {
          Cond::operator&((Cond *)&local_a0,
                          (ppVar11->first).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                          super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1,pCVar9);
          bVar12 = Cond::operator_cast_to_bool((Cond *)&local_a0);
          if (bVar12) {
            Vec<Hpipe::Cond>::up_to
                      ((Vec<Hpipe::Cond> *)&local_a0,&ppVar11->first,
                       (int)((ulong)((long)(ppVar11->first).
                                           super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                                           super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(ppVar11->first).
                                          super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                                          super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1);
            std::
            vector<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>,std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>>
            ::emplace_back<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*const&>
                      ((vector<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>,std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,Hpipe::Instruction*>>>
                        *)&local_58,(Vec<Hpipe::Cond> *)&local_a0,&ppVar11->second);
            if (local_a0.inst != (Instruction *)0x0) {
              operator_delete(local_a0.inst,
                              (long)local_a0.rcitem.
                                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)local_a0.inst)
              ;
            }
          }
        }
        inst = make_boyer_moore_rec
                         (local_b8,(Vec<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_> *
                                   )&local_58,local_b0,orig_front_size);
        local_d8.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_d8.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_d8.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition(&local_a0,inst,(Vec<unsigned_int> *)&local_d8,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)local_e0,&local_a0
                  );
        pIVar5 = local_60;
        if (local_a0.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a0.rcitem.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.rcitem.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)local_d8.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_d8.p.super__Base_bitset<4UL>._M_w[0],
                          local_d8.p.super__Base_bitset<4UL>._M_w[2] -
                          local_d8.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_d8.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_d8.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_d8.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  (&local_a0,&pIVar5->super_Instruction,(Vec<unsigned_int> *)&local_d8,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&inst->prev,
                   &local_a0);
        if (local_a0.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a0.rcitem.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.rcitem.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)local_d8.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_d8.p.super__Base_bitset<4UL>._M_w[0],
                          local_d8.p.super__Base_bitset<4UL>._M_w[2] -
                          local_d8.p.super__Base_bitset<4UL>._M_w[0]);
        }
        std::
        vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
        ::~vector((vector<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Vec<Hpipe::Cond>,_Hpipe::Instruction_*>_>_>
                   *)&local_58);
        pCVar9 = pCVar9 + 1;
      } while (pCVar9 != pCVar3);
    }
    if (local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
        super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
        super__Vector_impl_data._M_start != (Cond *)0x0) {
      operator_delete(local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                      super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                            super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
                            super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return &pIVar5->super_Instruction;
}

Assistant:

Instruction *InstructionGraph::make_boyer_moore_rec( const Vec<std::pair<Vec<Cond>, Instruction *> > &front, InstructionNextChar *next_char, int orig_front_size ) {
    //
    auto same_inst = [&]() {
        Instruction *f = front[ 0 ].second;
        for( unsigned i = 1; i < front.size(); ++i )
            if ( front[ i ].second != f )
                return false;
        return true;
    };
    if ( same_inst() )
        return front[ 0 ].second;

    // get the conds to test
    Vec<Cond> conds;
    for( const auto &p : front ) {
        Vec<Cond> old_conds = conds;
        Cond t = p.first.back();
        conds.clear();
        for( const Cond &c : old_conds ) {
            if ( Cond i = t & c )
                conds << i;
            if ( Cond i = ~t & c )
                conds << i;
            t &= ~c;
        }
        if ( t )
            conds << t;
    }
    std::sort( conds.begin(), conds.end(), []( const Cond &a, const Cond &b ) {
        return a.nz() < b.nz();
    } );

    //
    InstructionMultiCond *res = inst_pool << new InstructionMultiCond( next_char->cx, conds, front[ 0 ].first.size() - orig_front_size );
    for( const Cond &cond : conds ) {
        Vec<std::pair<Vec<Cond>, Instruction *> > new_front;
        for( const std::pair<Vec<Cond>, Instruction *> &p : front )
            if ( p.first.back() & cond )
                new_front.emplace_back( p.first.up_to( p.first.size() - 1 ), p.second );

        Instruction *next = make_boyer_moore_rec( new_front, next_char, orig_front_size );
        res->next << next;
        next->prev << res;
    }

    return res;

}